

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

char * key_type_to_str(int type)

{
  char *pcStack_10;
  int type_local;
  
  switch(type) {
  case 0:
    pcStack_10 = "unable to open file";
    break;
  case 1:
    pcStack_10 = "not a recognised key file format";
    break;
  case 2:
    pcStack_10 = "SSH-1 private key";
    break;
  case 3:
    pcStack_10 = "PuTTY SSH-2 private key";
    break;
  case 4:
    __assert_fail("false && \"OPENSSH_AUTO should never reach key_type_to_str\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/sshpubk.c",
                  0x782,"const char *key_type_to_str(int)");
  case 5:
    pcStack_10 = "OpenSSH SSH-2 private key (old PEM format)";
    break;
  case 6:
    pcStack_10 = "OpenSSH SSH-2 private key (new format)";
    break;
  case 7:
    pcStack_10 = "ssh.com SSH-2 private key";
    break;
  case 8:
    pcStack_10 = "SSH-1 public key";
    break;
  case 9:
    pcStack_10 = "SSH-2 public key (RFC 4716 format)";
    break;
  case 10:
    pcStack_10 = "SSH-2 public key (OpenSSH format)";
    break;
  default:
    __assert_fail("false && \"bad key type in key_type_to_str\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/sshpubk.c",
                  0x784,"const char *key_type_to_str(int)");
  }
  return pcStack_10;
}

Assistant:

const char *key_type_to_str(int type)
{
    switch (type) {
      case SSH_KEYTYPE_UNOPENABLE:
        return "unable to open file";
      case SSH_KEYTYPE_UNKNOWN:
        return "not a recognised key file format";
      case SSH_KEYTYPE_SSH1_PUBLIC:
        return "SSH-1 public key";
      case SSH_KEYTYPE_SSH2_PUBLIC_RFC4716:
        return "SSH-2 public key (RFC 4716 format)";
      case SSH_KEYTYPE_SSH2_PUBLIC_OPENSSH:
        return "SSH-2 public key (OpenSSH format)";
      case SSH_KEYTYPE_SSH1:
        return "SSH-1 private key";
      case SSH_KEYTYPE_SSH2:
        return "PuTTY SSH-2 private key";
      case SSH_KEYTYPE_OPENSSH_PEM:
        return "OpenSSH SSH-2 private key (old PEM format)";
      case SSH_KEYTYPE_OPENSSH_NEW:
        return "OpenSSH SSH-2 private key (new format)";
      case SSH_KEYTYPE_SSHCOM:
        return "ssh.com SSH-2 private key";

        /*
         * This function is called with a key type derived from
         * looking at an actual key file, so the output-only type
         * OPENSSH_AUTO should never get here, and is much an INTERNAL
         * ERROR as a code we don't even understand.
         */
      case SSH_KEYTYPE_OPENSSH_AUTO:
        unreachable("OPENSSH_AUTO should never reach key_type_to_str");
      default:
        unreachable("bad key type in key_type_to_str");
    }
}